

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireSimulationDataGenerator.cpp
# Opt level: O0

U32 __thiscall
OneWireSimulationDataGenerator::GenerateSimulationData
          (OneWireSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  U64 found_device;
  value_type local_58;
  undefined1 local_50 [8];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> device_ROMs;
  U32 delay;
  U64 adjusted_largest_sample_requested;
  SimulationChannelDescriptor **simulation_channels_local;
  U32 sample_rate_local;
  U64 largest_sample_requested_local;
  OneWireSimulationDataGenerator *this_local;
  
  uVar2 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while( true ) {
    uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if (uVar2 <= uVar3) break;
    if ((this->mSimOverdrive & 1U) == 1) {
      device_ROMs.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x1e;
    }
    else {
      device_ROMs.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0xfa;
    }
    iVar1 = (int)this;
    uVar4 = iVar1 + 0x18;
    UsToSamples(this,(ulong)(device_ROMs.
                             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 3));
    SimulationChannelDescriptor::Advance(uVar4);
    SimResetPacket(this);
    SimReadRom(this,0x8877665544332211);
    UsToSamples(this,(ulong)device_ROMs.
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    SimulationChannelDescriptor::Advance(uVar4);
    SimWriteByte(this,0x37);
    UsToSamples(this,(ulong)device_ROMs.
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    SimulationChannelDescriptor::Advance(uVar4);
    SimWriteByte(this,0xf0);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50);
    local_58 = 0x8877665544332211;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50,&local_58
              );
    found_device = 0x1122334455667788;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50,
               &found_device);
    SimResetPacket(this);
    SimSearchRom(this,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50);
    UsToSamples(this,(ulong)device_ROMs.
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    SimulationChannelDescriptor::Advance(iVar1 + 0x18);
    SimWriteByte(this,0xf);
    UsToSamples(this,(ulong)device_ROMs.
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    SimulationChannelDescriptor::Advance(iVar1 + 0x18);
    SimWriteByte(this,0xf0);
    UsToSamples(this,(ulong)device_ROMs.
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    SimulationChannelDescriptor::Advance(iVar1 + 0x18);
    SimWriteByte(this,0x55);
    UsToSamples(this,(ulong)device_ROMs.
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    SimulationChannelDescriptor::Advance(iVar1 + 0x18);
    SimWriteByte(this,0x18);
    SimResetPacket(this);
    SimMatchRom(this,0xf0e1d2c3b4a59687,false);
    UsToSamples(this,(ulong)device_ROMs.
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    SimulationChannelDescriptor::Advance(iVar1 + 0x18);
    SimWriteByte(this,0x55);
    UsToSamples(this,(ulong)device_ROMs.
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    SimulationChannelDescriptor::Advance(iVar1 + 0x18);
    SimWriteByte(this,0x18);
    SimResetPacket(this);
    UsToSamples(this,(ulong)device_ROMs.
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    SimulationChannelDescriptor::Advance(iVar1 + 0x18);
    SimWriteByte(this,0xec);
    if ((this->mSimOverdrive & 1U) == 0) {
      SimResetPacket(this);
      SimOverdriveSkipRom(this);
    }
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_50);
  }
  *simulation_channels = &this->mOneWireSimulationData;
  return 1;
}

Assistant:

U32 OneWireSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                            SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mOneWireSimulationData.GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        U32 delay;
        if( mSimOverdrive == true )
            delay = 30;
        else
            delay = 250;

        mOneWireSimulationData.Advance( U32( UsToSamples( delay * 3 ) ) );
        // mSimulationSampleIndex += UsToSamples(delay * 3, true);

        SimResetPacket();
        SimReadRom( 0x8877665544332211ull );

        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x37 );
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0xF0 );

        std::vector<U64> device_ROMs;
        device_ROMs.push_back( 0x8877665544332211ull );
        device_ROMs.push_back( 0x1122334455667788ull );

        SimResetPacket();
        U64 found_device;
        found_device = SimSearchRom( device_ROMs );

        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x0F );
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0xF0 );
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x55 );
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x18 );

        SimResetPacket();
        SimMatchRom( 0xF0E1D2C3B4A59687ull );


        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x55 );
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x18 );


        SimResetPacket();
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0xEC );


        if( !mSimOverdrive )
        {
            SimResetPacket();
            SimOverdriveSkipRom();
        }
    }

    *simulation_channels = &mOneWireSimulationData;


    return 1; // we are retuning the size of the SimulationChannelDescriptor array.  In our case, the "array" is length 1.
}